

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * isSimpleCount(Select *p,AggInfo *pAggInfo)

{
  Expr *pEVar1;
  Expr *pExpr;
  Table *pTab;
  AggInfo *pAggInfo_local;
  Select *p_local;
  
  if ((((p->pWhere == (Expr *)0x0) && (p->pEList->nExpr == 1)) && (p->pSrc->nSrc == 1)) &&
     (((p->pSrc->a[0].pSelect == (Select *)0x0 && (pAggInfo->nFunc == 1)) &&
      (p->pHaving == (Expr *)0x0)))) {
    p_local = (Select *)p->pSrc->a[0].pTab;
    if (*(u8 *)((long)&p_local->pGroupBy + 7) == '\0') {
      pEVar1 = p->pEList->a[0].pExpr;
      if (pEVar1->op == 0xa8) {
        if (pEVar1->pAggInfo == pAggInfo) {
          if ((pAggInfo->aFunc->pFunc->funcFlags & 0x100) == 0) {
            p_local = (Select *)0x0;
          }
          else if ((pEVar1->flags & 0x1000004) != 0) {
            p_local = (Select *)0x0;
          }
        }
        else {
          p_local = (Select *)0x0;
        }
      }
      else {
        p_local = (Select *)0x0;
      }
    }
    else {
      p_local = (Select *)0x0;
    }
  }
  else {
    p_local = (Select *)0x0;
  }
  return (Table *)p_local;
}

Assistant:

static Table *isSimpleCount(Select *p, AggInfo *pAggInfo){
  Table *pTab;
  Expr *pExpr;

  assert( !p->pGroupBy );

  if( p->pWhere
   || p->pEList->nExpr!=1
   || p->pSrc->nSrc!=1
   || p->pSrc->a[0].pSelect
   || pAggInfo->nFunc!=1
   || p->pHaving
  ){
    return 0;
  }
  pTab = p->pSrc->a[0].pTab;
  assert( pTab!=0 );
  assert( !IsView(pTab) );
  if( !IsOrdinaryTable(pTab) ) return 0;
  pExpr = p->pEList->a[0].pExpr;
  assert( pExpr!=0 );
  if( pExpr->op!=TK_AGG_FUNCTION ) return 0;
  if( pExpr->pAggInfo!=pAggInfo ) return 0;
  if( (pAggInfo->aFunc[0].pFunc->funcFlags&SQLITE_FUNC_COUNT)==0 ) return 0;
  assert( pAggInfo->aFunc[0].pFExpr==pExpr );
  testcase( ExprHasProperty(pExpr, EP_Distinct) );
  testcase( ExprHasProperty(pExpr, EP_WinFunc) );
  if( ExprHasProperty(pExpr, EP_Distinct|EP_WinFunc) ) return 0;

  return pTab;
}